

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::CopyPchCompilePdb
          (cmLocalGenerator *this,string *config,string *language,cmGeneratorTarget *target,
          string *ReuseFrom,cmGeneratorTarget *reuseTarget,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *extensions)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  cmTarget *this_00;
  __single_object _Var2;
  int iVar3;
  cmLocalGenerator *pcVar4;
  string *psVar5;
  string *psVar6;
  ostream *poVar7;
  cmSourceFile *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string_view expr;
  string_view expr_00;
  string_view expr_01;
  string_view expr_02;
  string_view expr_03;
  string to_dir;
  __single_object cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputs;
  anon_class_16_2_381a533d configGenex;
  string from_file;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_3b8;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_3b0;
  string dest_file;
  string local_378;
  string copy_script;
  string target_compile_pdb_dir;
  string pdb_prefix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e0;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_2c8;
  cmCustomCommandLines commandLines;
  cmGeneratedFileStream file;
  
  iVar3 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x28])();
  if ((char)iVar3 == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pdb_prefix,"",(allocator<char> *)&file);
  }
  else {
    cmStrCat<std::__cxx11::string_const&,char_const(&)[2]>
              (&pdb_prefix,config,(char (*) [2])0x7d6251);
  }
  pcVar4 = cmGeneratorTarget::GetLocalGenerator(target);
  psVar5 = GetCurrentBinaryDirectory_abi_cxx11_(pcVar4);
  psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[6]>
            (&target_compile_pdb_dir,psVar5,(char (*) [2])0x7d6251,psVar6,(char (*) [6])0x76fab5);
  file.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)(config->_M_dataplus)._M_p;
  cmStrCat<std::__cxx11::string_const&,char_const(&)[14],char_const*,char_const(&)[7]>
            (&copy_script,&target_compile_pdb_dir,(char (*) [14])"copy_idb_pdb_",(char **)&file,
             (char (*) [7])0x73c2db);
  cmGeneratedFileStream::cmGeneratedFileStream(&file,&copy_script,false,None);
  std::operator<<((ostream *)&file,"# CMake generated file\n");
  poVar7 = std::operator<<((ostream *)&file,
                           "# The compiler generated pdb file needs to be written to disk\n");
  poVar7 = std::operator<<(poVar7,"# by mspdbsrv. The foreach retry loop is needed to make sure\n");
  std::operator<<(poVar7,"# the pdb file is ready to be copied.\n\n");
  pbVar1 = (extensions->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (args_3 = (extensions->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; args_3 != pbVar1; args_3 = args_3 + 1) {
    pcVar4 = cmGeneratorTarget::GetLocalGenerator(reuseTarget);
    psVar5 = GetCurrentBinaryDirectory_abi_cxx11_(pcVar4);
    cmStrCat<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[19],std::__cxx11::string_const&,std::__cxx11::string_const&>
              (&from_file,psVar5,(char (*) [2])0x7d6251,ReuseFrom,
               (char (*) [19])".dir/${PDB_PREFIX}",ReuseFrom,args_3);
    pcVar4 = cmGeneratorTarget::GetLocalGenerator(target);
    psVar5 = GetCurrentBinaryDirectory_abi_cxx11_(pcVar4);
    psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    cmStrCat<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[19]>
              (&to_dir,psVar5,(char (*) [2])0x7d6251,psVar6,(char (*) [19])".dir/${PDB_PREFIX}");
    cmStrCat<std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
              ((string *)&outputs,&to_dir,ReuseFrom,args_3);
    std::__cxx11::string::string((string *)&dest_file,(string *)&outputs);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cc,"PREFIX",(allocator<char> *)&local_378);
    psVar5 = cmGeneratorTarget::GetSafeProperty(target,(string *)&cc);
    std::__cxx11::string::~string((string *)&cc);
    if (psVar5->_M_string_length != 0) {
      cmStrCat<std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
                ((string *)&cc,&to_dir,psVar5,ReuseFrom,args_3);
      std::__cxx11::string::operator=((string *)&dest_file,(string *)&cc);
      std::__cxx11::string::~string((string *)&cc);
    }
    std::operator<<((ostream *)&file,"foreach(retry RANGE 1 30)\n");
    poVar7 = std::operator<<((ostream *)&file,"  if (EXISTS \"");
    poVar7 = std::operator<<(poVar7,(string *)&from_file);
    poVar7 = std::operator<<(poVar7,"\" AND (NOT EXISTS \"");
    poVar7 = std::operator<<(poVar7,(string *)&dest_file);
    poVar7 = std::operator<<(poVar7,"\" OR NOT \"");
    poVar7 = std::operator<<(poVar7,(string *)&dest_file);
    poVar7 = std::operator<<(poVar7,"  \" IS_NEWER_THAN \"");
    poVar7 = std::operator<<(poVar7,(string *)&from_file);
    std::operator<<(poVar7,"\"))\n");
    std::operator<<((ostream *)&file,"    execute_process(COMMAND ${CMAKE_COMMAND} -E copy");
    poVar7 = std::operator<<((ostream *)&file," \"");
    poVar7 = std::operator<<(poVar7,(string *)&from_file);
    poVar7 = std::operator<<(poVar7,"\"");
    poVar7 = std::operator<<(poVar7," \"");
    poVar7 = std::operator<<(poVar7,(string *)&to_dir);
    poVar7 = std::operator<<(poVar7,"\" RESULT_VARIABLE result ");
    std::operator<<(poVar7," ERROR_QUIET)\n");
    poVar7 = std::operator<<((ostream *)&file,"    if (NOT result EQUAL 0)\n");
    poVar7 = std::operator<<(poVar7,"      execute_process(COMMAND ${CMAKE_COMMAND}");
    poVar7 = std::operator<<(poVar7," -E sleep 1)\n");
    std::operator<<(poVar7,"    else()\n");
    if (psVar5->_M_string_length != 0) {
      poVar7 = std::operator<<((ostream *)&file,"  file(REMOVE \"");
      poVar7 = std::operator<<(poVar7,(string *)&dest_file);
      std::operator<<(poVar7,"\")\n");
      poVar7 = std::operator<<((ostream *)&file,"  file(RENAME \"");
      poVar7 = std::operator<<(poVar7,(string *)&outputs);
      poVar7 = std::operator<<(poVar7,"\" \"");
      poVar7 = std::operator<<(poVar7,(string *)&dest_file);
      std::operator<<(poVar7,"\")\n");
    }
    poVar7 = std::operator<<((ostream *)&file,"      break()\n");
    std::operator<<(poVar7,"    endif()\n");
    poVar7 = std::operator<<((ostream *)&file,"  elseif(NOT EXISTS \"");
    poVar7 = std::operator<<(poVar7,(string *)&from_file);
    poVar7 = std::operator<<(poVar7,"\")\n");
    poVar7 = std::operator<<(poVar7,"    execute_process(COMMAND ${CMAKE_COMMAND}");
    poVar7 = std::operator<<(poVar7," -E sleep 1)\n");
    std::operator<<(poVar7,"  endif()\n");
    std::operator<<((ostream *)&file,"endforeach()\n");
    std::__cxx11::string::~string((string *)&dest_file);
    std::__cxx11::string::~string((string *)&outputs);
    std::__cxx11::string::~string((string *)&to_dir);
    std::__cxx11::string::~string((string *)&from_file);
  }
  configGenex.this = this;
  configGenex.config = config;
  psVar5 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  expr._M_str = (psVar5->_M_dataplus)._M_p;
  expr._M_len = psVar5->_M_string_length;
  CopyPchCompilePdb(std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget*,std::__cxx11::string_const&,cmGeneratorTarget*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
  ::$_0::operator()::char_traits<char>_>__const(&to_dir,&configGenex,expr);
  from_file._M_dataplus._M_p = (pointer)to_dir._M_string_length;
  from_file._M_string_length = (size_type)to_dir._M_dataplus._M_p;
  cmStrCat<char_const(&)[14],std::__cxx11::string_const&>
            (&dest_file,(char (*) [14])"-DPDB_PREFIX=",&pdb_prefix);
  expr_00._M_str = dest_file._M_dataplus._M_p;
  expr_00._M_len = dest_file._M_string_length;
  CopyPchCompilePdb(std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget*,std::__cxx11::string_const&,cmGeneratorTarget*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
  ::$_0::operator()::char_traits<char>_>__const((string *)&outputs,&configGenex,expr_00);
  from_file.field_2._M_allocated_capacity =
       (size_type)
       outputs.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  from_file.field_2._8_8_ =
       outputs.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  expr_01._M_str = "-P";
  expr_01._M_len = 2;
  CopyPchCompilePdb(std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget*,std::__cxx11::string_const&,cmGeneratorTarget*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
  ::$_0::operator()::char_traits<char>_>__const((string *)&cc,&configGenex,expr_01);
  expr_02._M_str = copy_script._M_dataplus._M_p;
  expr_02._M_len = copy_script._M_string_length;
  CopyPchCompilePdb(std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget*,std::__cxx11::string_const&,cmGeneratorTarget*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
  ::$_0::operator()::char_traits<char>_>__const(&local_378,&configGenex,expr_02);
  ilist._M_len = 4;
  ilist._M_array = (iterator)&from_file;
  cmMakeSingleCommandLine(&commandLines,ilist);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&cc);
  std::__cxx11::string::~string((string *)&outputs);
  std::__cxx11::string::~string((string *)&dest_file);
  std::__cxx11::string::~string((string *)&to_dir);
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmStrCat<std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,char_const(&)[5]>
            (&to_dir,&target_compile_pdb_dir,&pdb_prefix,ReuseFrom,(char (*) [5])".pdb");
  expr_03._M_str = to_dir._M_dataplus._M_p;
  expr_03._M_len = to_dir._M_string_length;
  CopyPchCompilePdb(std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget*,std::__cxx11::string_const&,cmGeneratorTarget*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
  ::$_0::operator()::char_traits<char>_>__const(&from_file,&configGenex,expr_03);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&outputs,
             &from_file);
  std::__cxx11::string::~string((string *)&from_file);
  std::__cxx11::string::~string((string *)&to_dir);
  std::make_unique<cmCustomCommand>();
  _Var2 = cc;
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
            (&local_2c8,
             &commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
  cmCustomCommand::SetCommandLines
            ((cmCustomCommand *)
             _Var2._M_t.
             super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
             super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
             super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,
             (cmCustomCommandLines *)&local_2c8);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_2c8);
  cmCustomCommand::SetComment
            ((cmCustomCommand *)
             cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
             _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
             super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,"");
  _Var2 = cc;
  *(undefined1 *)
   ((long)cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t
          .super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
          super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl + 0x12e) = 1;
  to_dir._M_dataplus._M_p = (pointer)&to_dir.field_2;
  to_dir._M_string_length = 0;
  to_dir.field_2._M_local_buf[0] = '\0';
  cmGeneratorTarget::GetPchFile(&from_file,reuseTarget,config,language,&to_dir);
  __l._M_len = 1;
  __l._M_array = &from_file;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&dest_file,__l,(allocator_type *)&local_378);
  cmCustomCommand::AppendDepends
            ((cmCustomCommand *)
             _Var2._M_t.
             super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
             super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
             super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&dest_file);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&dest_file);
  std::__cxx11::string::~string((string *)&from_file);
  std::__cxx11::string::~string((string *)&to_dir);
  iVar3 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x2a])();
  _Var2 = cc;
  if ((char)iVar3 == '\0') {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_2f8,&outputs);
    cmCustomCommand::SetOutputs
              ((cmCustomCommand *)
               _Var2._M_t.
               super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
               super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
               super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,&local_2f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2f8);
    local_3b8._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
    _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
         super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
         super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
    cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
    super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
         (__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>)0x0;
    this_01 = AddCustomCommandToOutput(this,&local_3b8,false);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_3b8)
    ;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&from_file,"CXX_SCAN_FOR_MODULES",(allocator<char> *)&dest_file);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&to_dir,"0",(allocator<char> *)&local_378);
    cmSourceFile::SetProperty(this_01,&from_file,&to_dir);
    std::__cxx11::string::~string((string *)&to_dir);
    std::__cxx11::string::~string((string *)&from_file);
    psVar5 = cmSourceFile::ResolveFullPath(this_01,(string *)0x0,(string *)0x0);
    cmGeneratorTarget::AddSource(target,psVar5,false);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_2e0,&outputs);
    cmCustomCommand::SetByproducts
              ((cmCustomCommand *)
               _Var2._M_t.
               super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
               super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
               super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,&local_2e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2e0);
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    local_3b0._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
    _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
         super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
         super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
    cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
    super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
         (__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>)0x0;
    AddCustomCommandToTarget(this,psVar5,PRE_BUILD,&local_3b0,Accept);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_3b0)
    ;
  }
  this_00 = target->Target;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&from_file,"COMPILE_PDB_OUTPUT_DIRECTORY",(allocator<char> *)&to_dir);
  cmTarget::SetProperty(this_00,&from_file,&target_compile_pdb_dir);
  std::__cxx11::string::~string((string *)&from_file);
  std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&cc);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&outputs);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
            (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
  cmGeneratedFileStream::~cmGeneratedFileStream(&file);
  std::__cxx11::string::~string((string *)&copy_script);
  std::__cxx11::string::~string((string *)&target_compile_pdb_dir);
  std::__cxx11::string::~string((string *)&pdb_prefix);
  return;
}

Assistant:

void cmLocalGenerator::CopyPchCompilePdb(
  const std::string& config, const std::string& language,
  cmGeneratorTarget* target, const std::string& ReuseFrom,
  cmGeneratorTarget* reuseTarget, const std::vector<std::string>& extensions)
{
  const std::string pdb_prefix =
    this->GetGlobalGenerator()->IsMultiConfig() ? cmStrCat(config, "/") : "";

  const std::string target_compile_pdb_dir =
    cmStrCat(target->GetLocalGenerator()->GetCurrentBinaryDirectory(), "/",
             target->GetName(), ".dir/");

  const std::string copy_script = cmStrCat(
    target_compile_pdb_dir, "copy_idb_pdb_", config.c_str(), ".cmake");
  cmGeneratedFileStream file(copy_script);

  file << "# CMake generated file\n";

  file << "# The compiler generated pdb file needs to be written to disk\n"
       << "# by mspdbsrv. The foreach retry loop is needed to make sure\n"
       << "# the pdb file is ready to be copied.\n\n";

  for (auto const& extension : extensions) {
    const std::string from_file =
      cmStrCat(reuseTarget->GetLocalGenerator()->GetCurrentBinaryDirectory(),
               "/", ReuseFrom, ".dir/${PDB_PREFIX}", ReuseFrom, extension);

    const std::string to_dir =
      cmStrCat(target->GetLocalGenerator()->GetCurrentBinaryDirectory(), "/",
               target->GetName(), ".dir/${PDB_PREFIX}");

    const std::string to_file = cmStrCat(to_dir, ReuseFrom, extension);

    std::string dest_file = to_file;

    std::string const& prefix = target->GetSafeProperty("PREFIX");
    if (!prefix.empty()) {
      dest_file = cmStrCat(to_dir, prefix, ReuseFrom, extension);
    }

    file << "foreach(retry RANGE 1 30)\n";
    file << "  if (EXISTS \"" << from_file << "\" AND (NOT EXISTS \""
         << dest_file << "\" OR NOT \"" << dest_file << "  \" IS_NEWER_THAN \""
         << from_file << "\"))\n";
    file << "    execute_process(COMMAND ${CMAKE_COMMAND} -E copy";
    file << " \"" << from_file << "\""
         << " \"" << to_dir << "\" RESULT_VARIABLE result "
         << " ERROR_QUIET)\n";
    file << "    if (NOT result EQUAL 0)\n"
         << "      execute_process(COMMAND ${CMAKE_COMMAND}"
         << " -E sleep 1)\n"
         << "    else()\n";
    if (!prefix.empty()) {
      file << "  file(REMOVE \"" << dest_file << "\")\n";
      file << "  file(RENAME \"" << to_file << "\" \"" << dest_file << "\")\n";
    }
    file << "      break()\n"
         << "    endif()\n";
    file << "  elseif(NOT EXISTS \"" << from_file << "\")\n"
         << "    execute_process(COMMAND ${CMAKE_COMMAND}"
         << " -E sleep 1)\n"
         << "  endif()\n";
    file << "endforeach()\n";
  }

  auto configGenex = [&](cm::string_view expr) -> std::string {
    if (this->GetGlobalGenerator()->IsMultiConfig()) {
      return cmStrCat("$<$<CONFIG:", config, ">:", expr, ">");
    }
    return std::string(expr);
  };

  cmCustomCommandLines commandLines = cmMakeSingleCommandLine(
    { configGenex(cmSystemTools::GetCMakeCommand()),
      configGenex(cmStrCat("-DPDB_PREFIX=", pdb_prefix)), configGenex("-P"),
      configGenex(copy_script) });

  const char* no_message = "";

  std::vector<std::string> outputs;
  outputs.push_back(configGenex(
    cmStrCat(target_compile_pdb_dir, pdb_prefix, ReuseFrom, ".pdb")));

  auto cc = cm::make_unique<cmCustomCommand>();
  cc->SetCommandLines(commandLines);
  cc->SetComment(no_message);
  cc->SetStdPipesUTF8(true);
  cc->AppendDepends({ reuseTarget->GetPchFile(config, language) });

  if (this->GetGlobalGenerator()->IsVisualStudio()) {
    cc->SetByproducts(outputs);
    this->AddCustomCommandToTarget(
      target->GetName(), cmCustomCommandType::PRE_BUILD, std::move(cc),
      cmObjectLibraryCommands::Accept);
  } else {
    cc->SetOutputs(outputs);
    cmSourceFile* copy_rule = this->AddCustomCommandToOutput(std::move(cc));
    copy_rule->SetProperty("CXX_SCAN_FOR_MODULES", "0");

    if (copy_rule) {
      target->AddSource(copy_rule->ResolveFullPath());
    }
  }

  target->Target->SetProperty("COMPILE_PDB_OUTPUT_DIRECTORY",
                              target_compile_pdb_dir);
}